

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int mbedtls_sha1_self_test(int verbose)

{
  int iVar1;
  undefined1 local_4a4 [8];
  mbedtls_sha1_context ctx;
  uchar sha1sum [20];
  uchar local_428 [8];
  uchar buf [1024];
  int local_1c;
  int ret;
  int buflen;
  int j;
  int i;
  int verbose_local;
  
  local_1c = 0;
  mbedtls_sha1_init((mbedtls_sha1_context *)local_4a4);
  buflen = 0;
  do {
    if (2 < buflen) {
      if (verbose != 0) {
        printf("\n");
      }
LAB_001116f7:
      mbedtls_sha1_free((mbedtls_sha1_context *)local_4a4);
      return local_1c;
    }
    if (verbose != 0) {
      printf("  SHA-1 test #%d: ",(ulong)(buflen + 1));
    }
    local_1c = mbedtls_sha1_starts_ret((mbedtls_sha1_context *)local_4a4);
    if (local_1c != 0) {
LAB_001116e1:
      if (verbose != 0) {
        printf("failed\n");
      }
      goto LAB_001116f7;
    }
    if (buflen == 2) {
      memset(local_428,0x61,1000);
      for (ret = 0; ret < 1000; ret = ret + 1) {
        local_1c = mbedtls_sha1_update_ret((mbedtls_sha1_context *)local_4a4,local_428,1000);
        if (local_1c != 0) goto LAB_001116e1;
      }
    }
    else {
      local_1c = mbedtls_sha1_update_ret
                           ((mbedtls_sha1_context *)local_4a4,sha1_test_buf[buflen],
                            sha1_test_buflen[buflen]);
      if (local_1c != 0) goto LAB_001116e1;
    }
    local_1c = mbedtls_sha1_finish_ret((mbedtls_sha1_context *)local_4a4,ctx.buffer + 0x38);
    if (local_1c != 0) goto LAB_001116e1;
    iVar1 = memcmp(ctx.buffer + 0x38,sha1_test_sum + buflen,0x14);
    if (iVar1 != 0) {
      local_1c = 1;
      goto LAB_001116e1;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    buflen = buflen + 1;
  } while( true );
}

Assistant:

int mbedtls_sha1_self_test( int verbose )
{
    int i, j, buflen, ret = 0;
    unsigned char buf[1024];
    unsigned char sha1sum[20];
    mbedtls_sha1_context ctx;

    mbedtls_sha1_init( &ctx );

    /*
     * SHA-1
     */
    for( i = 0; i < 3; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  SHA-1 test #%d: ", i + 1 );

        if( ( ret = mbedtls_sha1_starts_ret( &ctx ) ) != 0 )
            goto fail;

        if( i == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
            {
                ret = mbedtls_sha1_update_ret( &ctx, buf, buflen );
                if( ret != 0 )
                    goto fail;
            }
        }
        else
        {
            ret = mbedtls_sha1_update_ret( &ctx, sha1_test_buf[i],
                                           sha1_test_buflen[i] );
            if( ret != 0 )
                goto fail;
        }

        if( ( ret = mbedtls_sha1_finish_ret( &ctx, sha1sum ) ) != 0 )
            goto fail;

        if( memcmp( sha1sum, sha1_test_sum[i], 20 ) != 0 )
        {
            ret = 1;
            goto fail;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    goto exit;

fail:
    if( verbose != 0 )
        mbedtls_printf( "failed\n" );

exit:
    mbedtls_sha1_free( &ctx );

    return( ret );
}